

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O0

int64_t google::protobuf::util::TimeUtil::DurationToNanoseconds(Duration *duration)

{
  bool bVar1;
  int32_t iVar2;
  LogMessage *pLVar3;
  int64_t iVar4;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  LogMessageFatal local_28 [23];
  Voidify local_11;
  Duration *local_10;
  Duration *duration_local;
  
  local_10 = duration;
  bVar1 = IsDurationValid(duration);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    iVar4 = Duration::seconds(local_10);
    iVar2 = Duration::nanos(local_10);
    return iVar4 * 1000000000 + (long)iVar2;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"IsDurationValid(duration)");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/time_util.cc"
             ,0x134,local_38._M_len,local_38._M_str);
  pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
  pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar3,(char (*) [39])"Duration is outside of the valid range");
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_11,pLVar3);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
}

Assistant:

int64_t TimeUtil::DurationToNanoseconds(const Duration& duration) {
  ABSL_DCHECK(IsDurationValid(duration))
      << "Duration is outside of the valid range";
  return duration.seconds() * kNanosPerSecond + duration.nanos();
}